

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# idl_parser.cpp
# Opt level: O0

CheckedError __thiscall
flatbuffers::Parser::ParseVectorDelimiters<flatbuffers::Parser::SkipAnyJsonValue()::__1>
          (Parser *this,size_t *count,anon_class_8_1_8991fb9c body)

{
  bool bVar1;
  size_t *count_local;
  Parser *this_local;
  anon_class_8_1_8991fb9c body_local;
  CheckedError *ce;
  
  body_local.this = this;
  Expect(this,(int)count);
  bVar1 = CheckedError::Check((CheckedError *)this);
  if (!bVar1) {
    CheckedError::~CheckedError((CheckedError *)this);
    while ((((*(byte *)((long)count + 0x3ea) & 1) != 0 &&
            (((body.this)->super_ParserState).prev_cursor_ != (char *)0x0)) ||
           (bVar1 = Is((Parser *)count,0x5d), !bVar1))) {
      SkipAnyJsonValue::anon_class_8_1_8991fb9c::operator()
                ((anon_class_8_1_8991fb9c *)this,(size_t *)&this_local);
      bVar1 = CheckedError::Check((CheckedError *)this);
      if (bVar1) goto LAB_0012fffe;
      CheckedError::~CheckedError((CheckedError *)this);
      ((body.this)->super_ParserState).prev_cursor_ =
           ((body.this)->super_ParserState).prev_cursor_ + 1;
      bVar1 = Is((Parser *)count,0x5d);
      if (bVar1) break;
      ParseComma(this);
      bVar1 = CheckedError::Check((CheckedError *)this);
      if (bVar1) goto LAB_0012fffe;
      CheckedError::~CheckedError((CheckedError *)this);
    }
    Next(this);
    bVar1 = CheckedError::Check((CheckedError *)this);
    if (!bVar1) {
      CheckedError::~CheckedError((CheckedError *)this);
      anon_unknown_0::NoError();
    }
  }
LAB_0012fffe:
  return SUB82(this,0);
}

Assistant:

CheckedError Parser::ParseVectorDelimiters(size_t &count, F body) {
  EXPECT('[');
  for (;;) {
    if ((!opts.strict_json || !count) && Is(']')) break;
    ECHECK(body(count));
    count++;
    if (Is(']')) break;
    ECHECK(ParseComma());
  }
  NEXT();
  return NoError();
}